

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

stbi_uc * stbi_load_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  float *data;
  stbi_uc *psVar2;
  int local_54;
  float *hdr;
  int i;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  FILE *f_local;
  
  iVar1 = stbi_jpeg_test_file(f);
  if (iVar1 == 0) {
    iVar1 = stbi_png_test_file(f);
    if (iVar1 == 0) {
      iVar1 = stbi_bmp_test_file(f);
      if (iVar1 == 0) {
        iVar1 = stbi_psd_test_file(f);
        if (iVar1 == 0) {
          iVar1 = stbi_dds_test_file(f);
          if (iVar1 == 0) {
            iVar1 = stbi_hdr_test_file(f);
            if (iVar1 == 0) {
              for (hdr._0_4_ = 0; (int)hdr < max_loaders; hdr._0_4_ = (int)hdr + 1) {
                iVar1 = (*loaders[(int)hdr]->test_file)(f);
                if (iVar1 != 0) {
                  psVar2 = (*loaders[(int)hdr]->load_from_file)(f,x,y,comp,req_comp);
                  return psVar2;
                }
              }
              iVar1 = stbi_tga_test_file(f);
              if (iVar1 == 0) {
                e("Image not of any known type, or corrupt");
                f_local = (FILE *)0x0;
              }
              else {
                f_local = (FILE *)stbi_tga_load_from_file(f,x,y,comp,req_comp);
              }
            }
            else {
              data = stbi_hdr_load_from_file(f,x,y,comp,req_comp);
              local_54 = req_comp;
              if (req_comp == 0) {
                local_54 = *comp;
              }
              f_local = (FILE *)hdr_to_ldr(data,*x,*y,local_54);
            }
          }
          else {
            f_local = (FILE *)stbi_dds_load_from_file(f,x,y,comp,req_comp);
          }
        }
        else {
          f_local = (FILE *)stbi_psd_load_from_file(f,x,y,comp,req_comp);
        }
      }
      else {
        f_local = (FILE *)stbi_bmp_load_from_file(f,x,y,comp,req_comp);
      }
    }
    else {
      f_local = (FILE *)stbi_png_load_from_file(f,x,y,comp,req_comp);
    }
  }
  else {
    f_local = (FILE *)stbi_jpeg_load_from_file(f,x,y,comp,req_comp);
  }
  return (stbi_uc *)f_local;
}

Assistant:

unsigned char *stbi_load_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   int i;
   if (stbi_jpeg_test_file(f))
      return stbi_jpeg_load_from_file(f,x,y,comp,req_comp);
   if (stbi_png_test_file(f))
      return stbi_png_load_from_file(f,x,y,comp,req_comp);
   if (stbi_bmp_test_file(f))
      return stbi_bmp_load_from_file(f,x,y,comp,req_comp);
   if (stbi_psd_test_file(f))
      return stbi_psd_load_from_file(f,x,y,comp,req_comp);
   #ifndef STBI_NO_DDS
   if (stbi_dds_test_file(f))
      return stbi_dds_load_from_file(f,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_HDR
   if (stbi_hdr_test_file(f)) {
      float *hdr = stbi_hdr_load_from_file(f, x,y,comp,req_comp);
      return hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif
   for (i=0; i < max_loaders; ++i)
      if (loaders[i]->test_file(f))
         return loaders[i]->load_from_file(f,x,y,comp,req_comp);
   // test tga last because it's a crappy test!
   if (stbi_tga_test_file(f))
      return stbi_tga_load_from_file(f,x,y,comp,req_comp);
   return epuc("unknown image type", "Image not of any known type, or corrupt");
}